

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int update_traffic_key(ptls_t *tls,int is_enc)

{
  long lVar1;
  void *p;
  int in_ESI;
  long in_RDI;
  ptls_iovec_t pVar2;
  char *in_stack_00000048;
  size_t in_stack_00000050;
  void *in_stack_00000058;
  ptls_hash_algorithm_t *hash;
  int ret;
  undefined1 in_stack_00000068 [16];
  uint8_t secret [64];
  st_ptls_traffic_protection_t *tp;
  int skip_notify;
  ptls_t *tls_00;
  int local_5c;
  undefined1 local_58 [64];
  void *local_18;
  
  if (in_ESI == 0) {
    p = (void *)(in_RDI + 0x58);
  }
  else {
    p = (void *)(in_RDI + 0xb0);
  }
  lVar1 = *(long *)(*(long *)(in_RDI + 0x50) + 0x58);
  skip_notify = (int)((ulong)*(undefined8 *)(lVar1 + 8) >> 0x20);
  local_18 = p;
  pVar2 = ptls_iovec_init(p,*(size_t *)(lVar1 + 8));
  tls_00 = (ptls_t *)pVar2.base;
  pVar2 = ptls_iovec_init((void *)0x0,0);
  local_5c = hkdf_expand_label(hash,in_stack_00000058,in_stack_00000050,
                               (ptls_iovec_t)in_stack_00000068,in_stack_00000048,
                               (ptls_iovec_t)secret._16_16_,(char *)secret._32_8_);
  if (local_5c == 0) {
    memcpy(local_18,local_58,0x40);
    local_5c = setup_traffic_protection
                         (tls_00,pVar2.len._4_4_,(char *)pVar2.base,(size_t)p,skip_notify);
  }
  (*ptls_clear_memory)(local_58,0x40);
  return local_5c;
}

Assistant:

static int update_traffic_key(ptls_t *tls, int is_enc)
{
    struct st_ptls_traffic_protection_t *tp = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;
    uint8_t secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_hash_algorithm_t *hash = tls->key_schedule->hashes[0].algo;
    if ((ret = hkdf_expand_label(hash, secret, hash->digest_size, ptls_iovec_init(tp->secret, hash->digest_size), "traffic upd",
                                 ptls_iovec_init(NULL, 0), tls->key_schedule->hkdf_label_prefix)) != 0)
        goto Exit;
    memcpy(tp->secret, secret, sizeof(secret));
    ret = setup_traffic_protection(tls, is_enc, NULL, 3, 1);

Exit:
    ptls_clear_memory(secret, sizeof(secret));
    return ret;
}